

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O1

Keyset * __thiscall GT7VolumeFile::getKeyset(GT7VolumeFile *this)

{
  int iVar1;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  if (getKeyset()::keyset == '\0') {
    iVar1 = __cxa_guard_acquire(&getKeyset()::keyset);
    if (iVar1 != 0) {
      local_30 = local_20;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"KYZYLKUM-873068469","");
      getKeyset::keyset.m_magic._M_dataplus._M_p = (pointer)&getKeyset::keyset.m_magic.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&getKeyset::keyset,local_30,local_28 + (long)local_30);
      getKeyset::keyset.m_key._M_elems[0] = _DAT_00166360;
      getKeyset::keyset.m_key._M_elems[1] = _UNK_00166364;
      getKeyset::keyset.m_key._M_elems[2] = _UNK_00166368;
      getKeyset::keyset.m_key._M_elems[3] = _UNK_0016636c;
      if (local_30 != local_20) {
        operator_delete(local_30,local_20[0] + 1);
      }
      __cxa_atexit(Keyset::~Keyset,&getKeyset::keyset,&__dso_handle);
      __cxa_guard_release(&getKeyset()::keyset);
    }
  }
  return &getKeyset::keyset;
}

Assistant:

const Keyset& GT7VolumeFile::getKeyset() const
{
	static const Keyset keyset({
		"KYZYLKUM-873068469", {{ 0xC9DA80A5, 0x050DA9A1, 0x9EB1FE65, 0xB651F2FB }}
	});
	return keyset;
}